

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr
GetFunctionTypeName(ExpressionContext *ctx,TypeBase *returnType,IntrusiveList<TypeHandle> arguments)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeHandle *pTVar4;
  size_t sVar5;
  TypeHandle *local_60;
  TypeHandle *arg_1;
  char *pos;
  char *name;
  TypeHandle *arg;
  uint nameLength;
  TypeBase *returnType_local;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> arguments_local;
  char *__s;
  
  arguments_local.head = arguments.tail;
  uVar2 = InplaceStr::length(&returnType->name);
  arg._4_4_ = uVar2 + 7;
  local_60 = arguments.head;
  for (name = (char *)local_60; name != (char *)0x0; name = *(char **)(name + 8)) {
    uVar2 = InplaceStr::length((InplaceStr *)(*(long *)name + 0x10));
    arg._4_4_ = uVar2 + (*(long *)(name + 8) != 0) + arg._4_4_;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)arg._4_4_);
  __s = (char *)CONCAT44(extraout_var,iVar3);
  if ((returnType->name).begin != (char *)0x0) {
    pcVar1 = (returnType->name).begin;
    uVar2 = InplaceStr::length(&returnType->name);
    memcpy(__s,pcVar1,(ulong)uVar2);
  }
  uVar2 = InplaceStr::length(&returnType->name);
  builtin_strncpy(__s + uVar2," ref(",5);
  arg_1 = (TypeHandle *)(__s + uVar2 + 5);
  for (; local_60 != (TypeHandle *)0x0; local_60 = local_60->next) {
    if ((local_60->type->name).begin != (char *)0x0) {
      pcVar1 = (local_60->type->name).begin;
      uVar2 = InplaceStr::length(&local_60->type->name);
      memcpy(arg_1,pcVar1,(ulong)uVar2);
    }
    uVar2 = InplaceStr::length(&local_60->type->name);
    pTVar4 = (TypeHandle *)((long)&arg_1->type + (ulong)uVar2);
    arg_1 = pTVar4;
    if (local_60->next != (TypeHandle *)0x0) {
      arg_1 = (TypeHandle *)((long)&pTVar4->type + 1);
      *(undefined1 *)&pTVar4->type = 0x2c;
    }
  }
  *(undefined1 *)&arg_1->type = 0x29;
  *(undefined1 *)((long)&arg_1->type + 1) = 0;
  sVar5 = strlen(__s);
  if (sVar5 + 1 == (ulong)arg._4_4_) {
    InplaceStr::InplaceStr((InplaceStr *)&arguments_local.tail,__s);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0xd7,
                "InplaceStr GetFunctionTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

InplaceStr GetFunctionTypeName(ExpressionContext &ctx, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	unsigned nameLength = returnType->name.length() + unsigned(strlen(" ref()")) + 1;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	if(returnType->name.begin)
		memcpy(pos, returnType->name.begin, returnType->name.length());
	pos += returnType->name.length();

	memcpy(pos, " ref(", 5);
	pos += 5;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
	{
		if(arg->type->name.begin)
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}